

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,Int ent_dim,
          vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs)

{
  LO size_in;
  Int IVar1;
  void *extraout_RDX;
  Int class_dim;
  Read<signed_char> RVar2;
  Read<signed_char> class_dim_marks;
  vector<int,_std::allocator<int>_> dim_class_ids;
  Write<signed_char> local_98;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *local_88;
  string local_80;
  Write<signed_char> local_60;
  Write<signed_char> local_50;
  Omega_h local_40 [16];
  
  local_88 = class_pairs;
  size_in = Mesh::nents(mesh,ent_dim);
  std::__cxx11::string::string((string *)&local_80,"",(allocator *)&local_98);
  Read<signed_char>::Read((Read<signed_char> *)this,size_in,'\0',&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  class_dim = ent_dim;
  while( true ) {
    IVar1 = Mesh::dim(mesh);
    if (IVar1 < class_dim) break;
    get_dim_class_ids((vector<int,_std::allocator<int>_> *)&local_80,class_dim,local_88);
    if (local_80._M_dataplus._M_p != (pointer)local_80._M_string_length) {
      mark_class_closures((Omega_h *)&local_98,mesh,ent_dim,class_dim,
                          (vector<int,_std::allocator<int>_> *)&local_80);
      Write<signed_char>::Write(&local_50,(Write<signed_char> *)this);
      Write<signed_char>::Write(&local_60,&local_98);
      lor_each(local_40,(Bytes *)&local_50,(Bytes *)&local_60);
      Write<signed_char>::operator=((Write<signed_char> *)this,(Write<signed_char> *)local_40);
      Write<signed_char>::~Write((Write<signed_char> *)local_40);
      Write<signed_char>::~Write(&local_60);
      Write<signed_char>::~Write(&local_50);
      Write<signed_char>::~Write(&local_98);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_80);
    class_dim = class_dim + 1;
  }
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_class_closures(
    Mesh* mesh, Int ent_dim, std::vector<ClassPair> const& class_pairs) {
  auto marks = Read<I8>(mesh->nents(ent_dim), I8(0));
  for (Int class_dim = ent_dim; class_dim <= mesh->dim(); ++class_dim) {
    auto dim_class_ids = get_dim_class_ids(class_dim, class_pairs);
    if (dim_class_ids.empty()) continue;
    auto class_dim_marks =
        mark_class_closures(mesh, ent_dim, class_dim, dim_class_ids);
    marks = lor_each(marks, class_dim_marks);
  }
  return marks;
}